

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Value::~Value(Value *this)

{
  Value *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::~map(&this->object_value_);
  std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector(&this->array_value_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->binary_value_);
  std::__cxx11::string::~string((string *)&this->string_value_);
  return;
}

Assistant:

char Type() const { return static_cast<char>(type_); }